

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int skip_mode_by_threshold
              (PREDICTION_MODE mode,MV_REFERENCE_FRAME ref_frame,int_mv mv,int frames_since_golden,
              int *rd_threshes,int *rd_thresh_freq_fact,int64_t best_cost,int best_skip,
              int extra_shift)

{
  byte bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  byte in_DIL;
  long in_R8;
  long in_R9;
  int64_t in_stack_00000008;
  int in_stack_00000010;
  int64_t mode_rd_thresh;
  THR_MODES mode_index;
  int skip_this_mode;
  long local_40;
  long local_30;
  uint local_24;
  
  local_24 = 0;
  bVar1 = mode_idx[in_SIL][(int)(in_DIL - 0xd)];
  if (in_stack_00000010 == 0) {
    local_40 = (long)*(int *)(in_R8 + (ulong)bVar1 * 4) << ((byte)mode_rd_thresh & 0x3f);
  }
  else {
    local_40 = (long)*(int *)(in_R8 + (ulong)bVar1 * 4) << ((byte)mode_rd_thresh + 1 & 0x3f);
  }
  local_30 = local_40;
  if (((in_SIL != '\x01') && (local_30 = local_40 << 1, in_SIL == '\x04')) && (4 < in_ECX)) {
    local_30 = local_30 << ((byte)mode_rd_thresh + 1 & 0x3f);
  }
  iVar2 = rd_less_than_thresh(in_stack_00000008,local_30,*(int *)(in_R9 + (ulong)bVar1 * 4));
  if (iVar2 != 0) {
    local_24 = (uint)(in_EDX != 0);
  }
  return local_24;
}

Assistant:

static inline int skip_mode_by_threshold(PREDICTION_MODE mode,
                                         MV_REFERENCE_FRAME ref_frame,
                                         int_mv mv, int frames_since_golden,
                                         const int *const rd_threshes,
                                         const int *const rd_thresh_freq_fact,
                                         int64_t best_cost, int best_skip,
                                         int extra_shift) {
  int skip_this_mode = 0;
  const THR_MODES mode_index = mode_idx[ref_frame][INTER_OFFSET(mode)];
  int64_t mode_rd_thresh =
      best_skip ? ((int64_t)rd_threshes[mode_index]) << (extra_shift + 1)
                : ((int64_t)rd_threshes[mode_index]) << extra_shift;

  // Increase mode_rd_thresh value for non-LAST for improved encoding
  // speed
  if (ref_frame != LAST_FRAME) {
    mode_rd_thresh = mode_rd_thresh << 1;
    if (ref_frame == GOLDEN_FRAME && frames_since_golden > 4)
      mode_rd_thresh = mode_rd_thresh << (extra_shift + 1);
  }

  if (rd_less_than_thresh(best_cost, mode_rd_thresh,
                          rd_thresh_freq_fact[mode_index]))
    if (mv.as_int != 0) skip_this_mode = 1;

  return skip_this_mode;
}